

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

int lj_trace_exit(jit_State *J,void *exptr)

{
  int *piVar1;
  lua_State *L_00;
  ptrdiff_t pVar2;
  ulong uVar3;
  uint *puVar4;
  ExitState *in_RSI;
  long in_RDI;
  bool bVar5;
  BCIns *retpc;
  ptrdiff_t argbase;
  GCtrace *T;
  void *cf;
  BCIns *pc;
  int errcode;
  ExitDataCP exd;
  ExitState *ex;
  lua_State *L;
  int olderr;
  undefined4 in_stack_ffffffffffffff48;
  MSize in_stack_ffffffffffffff4c;
  jit_State *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  lua_State *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  VMEvent ev;
  uint *local_80;
  long local_70;
  ExitState *local_68;
  uint *local_60;
  ExitState *local_58;
  lua_State *local_50;
  int local_44;
  ExitState *local_40;
  long local_38;
  int local_30;
  int local_2c;
  TValue *local_28;
  int local_1c;
  TValue *local_18;
  uint local_10;
  undefined4 local_c;
  lua_State *local_8;
  
  ev = (VMEvent)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_40 = in_RSI;
  local_38 = in_RDI;
  piVar1 = __errno_location();
  local_44 = *piVar1;
  local_50 = *(lua_State **)(local_38 + 0x60);
  local_58 = local_40;
  L_00 = (lua_State *)
         (ulong)*(uint *)(*(long *)(local_38 + 0x130) + (ulong)*(uint *)(local_38 + 0x958) * 4);
  local_70 = local_38;
  local_68 = local_40;
  local_30 = lj_vm_cpcall(local_50,0,&local_70,trace_exit_cp);
  if (local_30 == 0) {
    if (((*(byte *)((ulong)(local_50->glref).ptr32 + 0x93) & 8) != 0) &&
       (pVar2 = lj_vmevent_prepare(L_00,ev), pVar2 != 0)) {
      local_8 = local_50;
      local_c = 0x38;
      if ((long)((ulong)(local_50->maxstack).ptr32 - (long)local_50->top) < 0x1c1) {
        lj_state_growstack((lua_State *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      }
      local_18 = local_50->top;
      local_50->top = local_18 + 1;
      local_1c = *(int *)(local_38 + 0x958);
      local_18->n = (double)local_1c;
      local_28 = local_50->top;
      local_50->top = local_28 + 1;
      local_2c = *(int *)(local_38 + 0x95c);
      local_28->n = (double)local_2c;
      trace_exit_regs(local_50,local_58);
      lj_vmevent_call(in_stack_ffffffffffffff60,
                      CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    }
    local_80 = local_60;
    uVar3 = (ulong)local_50->cframe & 0xfffffffffffffffc;
    *(int *)(uVar3 + 0x1c) = (int)local_60;
    if ((*(char *)((ulong)(local_50->glref).ptr32 + 0x29) == '\x02') ||
       (*(char *)((ulong)(local_50->glref).ptr32 + 0x29) == '\x05')) {
      if ((*(byte *)((ulong)(local_50->glref).ptr32 + 0x91) & 0x40) == 0) {
        lj_gc_step((lua_State *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      }
    }
    else {
      trace_hotside(in_stack_ffffffffffffff50,
                    (BCIns *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
    if ((*local_60 & 0xff) == 0x53) {
      puVar4 = (uint *)((ulong)*(uint *)(*(long *)(local_38 + 0x130) +
                                        (ulong)(*local_60 >> 0x10) * 4) + 0x38);
      local_10 = *puVar4 & 0xff;
      bVar5 = true;
      if (((local_10 != 0x45) && (bVar5 = true, local_10 != 0x46)) &&
         (bVar5 = true, local_10 != 0x47)) {
        bVar5 = local_10 == 0x48;
      }
      if (bVar5) {
        if (*(int *)(local_38 + 0xbc) == 0x11) {
          *(uint *)(local_38 + 0x968) = *local_60;
          *(uint **)(local_38 + 0x960) = local_60;
          **(uint **)(local_38 + 0x960) = *puVar4;
          *(undefined1 *)(local_38 + 0x97) = 1;
        }
        else {
          *(int *)(uVar3 + 0x1c) = (int)puVar4;
          local_80 = puVar4;
        }
      }
    }
    piVar1 = __errno_location();
    *piVar1 = local_44;
    switch((char)*local_80) {
    case '<':
      local_30 = ((int)((long)local_50->top - (long)local_50->base >> 3) + 1) -
                 (*local_80 >> 8 & 0xff);
      break;
    case '=':
    case '?':
      local_30 = ((int)((long)local_50->top - (long)local_50->base >> 3) - (*local_80 >> 8 & 0xff))
                 - (*local_80 >> 0x10 & 0xff);
      break;
    default:
      if ((*local_80 & 0xff) < 0x55) {
        local_30 = 0;
      }
      else {
        local_30 = (int)((long)local_50->top - (long)local_50->base >> 3) + 1;
      }
      break;
    case 'E':
      local_30 = (((int)((long)local_50->top - (long)local_50->base >> 3) + 1) -
                 (*local_80 >> 8 & 0xff)) - (*local_80 >> 0x10);
    }
  }
  else {
    local_30 = -local_30;
  }
  return local_30;
}

Assistant:

int LJ_FASTCALL lj_trace_exit(jit_State *J, void *exptr)
{
  ERRNO_SAVE
  lua_State *L = J->L;
  ExitState *ex = (ExitState *)exptr;
  ExitDataCP exd;
  int errcode;
  const BCIns *pc;
  void *cf;
  GCtrace *T;
#ifdef EXITSTATE_PCREG
  J->parent = trace_exit_find(J, (MCode *)(intptr_t)ex->gpr[EXITSTATE_PCREG]);
#endif
  T = traceref(J, J->parent); UNUSED(T);
#ifdef EXITSTATE_CHECKEXIT
  if (J->exitno == T->nsnap) {  /* Treat stack check like a parent exit. */
    lua_assert(T->root != 0);
    J->exitno = T->ir[REF_BASE].op2;
    J->parent = T->ir[REF_BASE].op1;
    T = traceref(J, J->parent);
  }
#endif
  lua_assert(T != NULL && J->exitno < T->nsnap);
  exd.J = J;
  exd.exptr = exptr;
  errcode = lj_vm_cpcall(L, NULL, &exd, trace_exit_cp);
  if (errcode)
    return -errcode;  /* Return negated error code. */

  lj_vmevent_send(L, TEXIT,
    lj_state_checkstack(L, 4+RID_NUM_GPR+RID_NUM_FPR+LUA_MINSTACK);
    setintV(L->top++, J->parent);
    setintV(L->top++, J->exitno);
    trace_exit_regs(L, ex);
  );

  pc = exd.pc;
  cf = cframe_raw(L->cframe);
  setcframe_pc(cf, pc);
  if (G(L)->gc.state == GCSatomic || G(L)->gc.state == GCSfinalize) {
    if (!(G(L)->hookmask & HOOK_GC))
      lj_gc_step(L);  /* Exited because of GC: drive GC forward. */
  } else {
    trace_hotside(J, pc);
  }
  if (bc_op(*pc) == BC_JLOOP) {
    BCIns *retpc = &traceref(J, bc_d(*pc))->startins;
    if (bc_isret(bc_op(*retpc))) {
      if (J->state == LJ_TRACE_RECORD) {
	J->patchins = *pc;
	J->patchpc = (BCIns *)pc;
	*J->patchpc = *retpc;
	J->bcskip = 1;
      } else {
	pc = retpc;
	setcframe_pc(cf, pc);
      }
    }
  }
  /* Return MULTRES or 0. */
  ERRNO_RESTORE
  switch (bc_op(*pc)) {
  case BC_CALLM: case BC_CALLMT:
    return (int)((BCReg)(L->top - L->base) - bc_a(*pc) - bc_c(*pc));
  case BC_RETM:
    return (int)((BCReg)(L->top - L->base) + 1 - bc_a(*pc) - bc_d(*pc));
  case BC_TSETM:
    return (int)((BCReg)(L->top - L->base) + 1 - bc_a(*pc));
  default:
    if (bc_op(*pc) >= BC_FUNCF)
      return (int)((BCReg)(L->top - L->base) + 1);
    return 0;
  }
}